

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::student_t_dist<float>::icdf(student_t_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  result_type_conflict1 rVar2;
  
  if ((x <= 0.0) || (1.0 <= x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    return NAN;
  }
  if ((x == 0.0) && (!NAN(x))) {
    return -INFINITY;
  }
  if ((x == 1.0) && (!NAN(x))) {
    return INFINITY;
  }
  rVar2 = icdf_(this,x);
  return rVar2;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }